

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcUtil.c
# Opt level: O2

Lpk_Fun_t * Lpk_FunDup(Lpk_Fun_t *p,uint *pTruth)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint uVar9;
  Lpk_Fun_t *Entry;
  
  Entry = Lpk_FunAlloc(*(uint *)&p->field_0x8 >> 7 & 0x1f);
  uVar9 = p->vNodes->nSize;
  Entry->vNodes = p->vNodes;
  uVar1 = *(uint *)&p->field_0x8;
  *(uint *)&Entry->field_0x8 =
       uVar1 & 0x3fffff80 | *(uint *)&Entry->field_0x8 & 0xc0000000 | uVar9 & 0x7f;
  Entry->nDelayLim = p->nDelayLim;
  uVar9 = Kit_TruthSupport(pTruth,uVar1 >> 7 & 0x1f);
  Entry->uSupp = uVar9;
  Kit_TruthCopy((uint *)&Entry->field_0xe4,pTruth,*(uint *)&p->field_0x8 >> 7 & 0x1f);
  uVar2 = *(undefined8 *)(p->pFanins + 8);
  *(undefined8 *)Entry->pFanins = *(undefined8 *)p->pFanins;
  *(undefined8 *)(Entry->pFanins + 8) = uVar2;
  uVar2 = *(undefined8 *)(p->pDelays + 2);
  uVar3 = *(undefined8 *)(p->pDelays + 4);
  uVar4 = *(undefined8 *)(p->pDelays + 6);
  uVar5 = *(undefined8 *)(p->pDelays + 8);
  uVar6 = *(undefined8 *)(p->pDelays + 10);
  uVar7 = *(undefined8 *)(p->pDelays + 0xc);
  uVar8 = *(undefined8 *)(p->pDelays + 0xe);
  *(undefined8 *)Entry->pDelays = *(undefined8 *)p->pDelays;
  *(undefined8 *)(Entry->pDelays + 2) = uVar2;
  *(undefined8 *)(Entry->pDelays + 4) = uVar3;
  *(undefined8 *)(Entry->pDelays + 6) = uVar4;
  *(undefined8 *)(Entry->pDelays + 8) = uVar5;
  *(undefined8 *)(Entry->pDelays + 10) = uVar6;
  *(undefined8 *)(Entry->pDelays + 0xc) = uVar7;
  *(undefined8 *)(Entry->pDelays + 0xe) = uVar8;
  Vec_PtrPush(p->vNodes,Entry);
  return Entry;
}

Assistant:

Lpk_Fun_t * Lpk_FunDup( Lpk_Fun_t * p, unsigned * pTruth )
{
    Lpk_Fun_t * pNew;
    pNew = Lpk_FunAlloc( p->nVars );
    pNew->Id = Vec_PtrSize(p->vNodes);
    pNew->vNodes = p->vNodes;
    pNew->nVars = p->nVars;
    pNew->nLutK = p->nLutK;
    pNew->nAreaLim = p->nAreaLim;
    pNew->nDelayLim = p->nDelayLim;
    pNew->uSupp = Kit_TruthSupport( pTruth, p->nVars );
    Kit_TruthCopy( Lpk_FunTruth(pNew,0), pTruth, p->nVars );
    memcpy( pNew->pFanins, p->pFanins, 16 );
    memcpy( pNew->pDelays, p->pDelays, sizeof(int)*16 );
    Vec_PtrPush( p->vNodes, pNew );
    return pNew;
}